

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O2

void idct4_w4_sse2(__m128i *input,__m128i *output)

{
  __m128i alVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  __m128i alVar9;
  undefined1 auVar10 [16];
  __m128i _in1_1;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  __m128i _in1;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  
  alVar9 = *input;
  alVar1 = input[1];
  auVar13._0_12_ = alVar9._0_12_;
  auVar13._12_2_ = alVar9[0]._6_2_;
  auVar13._14_2_ = *(undefined2 *)((long)input[2] + 6);
  auVar12._12_4_ = auVar13._12_4_;
  auVar12._0_10_ = alVar9._0_10_;
  auVar12._10_2_ = *(undefined2 *)((long)input[2] + 4);
  auVar11._10_6_ = auVar12._10_6_;
  auVar11._0_8_ = alVar9[0];
  auVar11._8_2_ = alVar9[0]._4_2_;
  auVar10._8_8_ = auVar11._8_8_;
  auVar10._6_2_ = *(undefined2 *)((long)input[2] + 2);
  auVar10._4_2_ = alVar9[0]._2_2_;
  auVar10._0_2_ = (undefined2)alVar9[0];
  auVar10._2_2_ = (short)input[2][0];
  auVar4._8_4_ = 0xb500b50;
  auVar4._0_8_ = 0xb500b500b500b50;
  auVar4._12_4_ = 0xb500b50;
  auVar3 = pmaddwd(auVar4,auVar10);
  auVar2._8_4_ = 0xf4b00b50;
  auVar2._0_8_ = 0xf4b00b50f4b00b50;
  auVar2._12_4_ = 0xf4b00b50;
  auVar2 = pmaddwd(auVar2,auVar10);
  auVar17._0_4_ = auVar3._0_4_ + 0x800 >> 0xc;
  auVar17._4_4_ = auVar3._4_4_ + 0x800 >> 0xc;
  auVar17._8_4_ = auVar3._8_4_ + 0x800 >> 0xc;
  auVar17._12_4_ = auVar3._12_4_ + 0x800 >> 0xc;
  auVar3._0_4_ = auVar2._0_4_ + 0x800 >> 0xc;
  auVar3._4_4_ = auVar2._4_4_ + 0x800 >> 0xc;
  auVar3._8_4_ = auVar2._8_4_ + 0x800 >> 0xc;
  auVar3._12_4_ = auVar2._12_4_ + 0x800 >> 0xc;
  auVar4 = packssdw(auVar17,auVar17);
  auVar2 = packssdw(auVar3,auVar3);
  auVar8._0_12_ = alVar1._0_12_;
  auVar8._12_2_ = alVar1[0]._6_2_;
  auVar8._14_2_ = *(undefined2 *)((long)input[3] + 6);
  auVar7._12_4_ = auVar8._12_4_;
  auVar7._0_10_ = alVar1._0_10_;
  auVar7._10_2_ = *(undefined2 *)((long)input[3] + 4);
  auVar6._10_6_ = auVar7._10_6_;
  auVar6._0_8_ = alVar1[0];
  auVar6._8_2_ = alVar1[0]._4_2_;
  auVar5._8_8_ = auVar6._8_8_;
  auVar5._6_2_ = *(undefined2 *)((long)input[3] + 2);
  auVar5._4_2_ = alVar1[0]._2_2_;
  auVar5._0_2_ = (undefined2)alVar1[0];
  auVar5._2_2_ = (short)input[3][0];
  auVar14._8_4_ = 0xf138061f;
  auVar14._0_8_ = 0xf138061ff138061f;
  auVar14._12_4_ = 0xf138061f;
  auVar3 = pmaddwd(auVar14,auVar5);
  auVar16._8_4_ = 0x61f0ec8;
  auVar16._0_8_ = 0x61f0ec8061f0ec8;
  auVar16._12_4_ = 0x61f0ec8;
  auVar17 = pmaddwd(auVar16,auVar5);
  auVar15._0_4_ = auVar3._0_4_ + 0x800 >> 0xc;
  auVar15._4_4_ = auVar3._4_4_ + 0x800 >> 0xc;
  auVar15._8_4_ = auVar3._8_4_ + 0x800 >> 0xc;
  auVar15._12_4_ = auVar3._12_4_ + 0x800 >> 0xc;
  auVar18._0_4_ = auVar17._0_4_ + 0x800 >> 0xc;
  auVar18._4_4_ = auVar17._4_4_ + 0x800 >> 0xc;
  auVar18._8_4_ = auVar17._8_4_ + 0x800 >> 0xc;
  auVar18._12_4_ = auVar17._12_4_ + 0x800 >> 0xc;
  auVar3 = packssdw(auVar15,auVar15);
  auVar17 = packssdw(auVar18,auVar18);
  alVar9 = (__m128i)paddsw(auVar4,auVar17);
  *output = alVar9;
  alVar9 = (__m128i)psubsw(auVar4,auVar17);
  output[3] = alVar9;
  alVar9 = (__m128i)paddsw(auVar2,auVar3);
  output[1] = alVar9;
  alVar9 = (__m128i)psubsw(auVar2,auVar3);
  output[2] = alVar9;
  return;
}

Assistant:

static void idct4_w4_sse2(const __m128i *input, __m128i *output) {
  const int8_t cos_bit = INV_COS_BIT;
  const int32_t *cospi = cospi_arr(INV_COS_BIT);
  const __m128i __rounding = _mm_set1_epi32(1 << (INV_COS_BIT - 1));

  const __m128i cospi_p32_p32 = pair_set_epi16(cospi[32], cospi[32]);
  const __m128i cospi_p32_m32 = pair_set_epi16(cospi[32], -cospi[32]);
  const __m128i cospi_p48_m16 = pair_set_epi16(cospi[48], -cospi[16]);
  const __m128i cospi_p16_p48 = pair_set_epi16(cospi[16], cospi[48]);

  // stage 1
  __m128i x[4];
  x[0] = input[0];
  x[1] = input[2];
  x[2] = input[1];
  x[3] = input[3];

  // stage 2
  btf_16_4p_sse2(cospi_p32_p32, cospi_p32_m32, x[0], x[1], x[0], x[1]);
  btf_16_4p_sse2(cospi_p48_m16, cospi_p16_p48, x[2], x[3], x[2], x[3]);

  // stage 3
  btf_16_adds_subs_out_sse2(output[0], output[3], x[0], x[3]);
  btf_16_adds_subs_out_sse2(output[1], output[2], x[1], x[2]);
}